

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdragdrop.cpp
# Opt level: O2

int main(void)

{
  ushort uVar1;
  undefined8 uVar2;
  Am_Wrapper *pAVar3;
  Am_Constraint *pAVar4;
  undefined8 uVar5;
  Am_Object *pAVar6;
  Am_Value_List *pAVar7;
  undefined8 uVar8;
  ulong uVar9;
  Am_Slot_Flags flags;
  Am_Value_List select_list;
  Am_Object local_1a0 [16];
  Am_Object local_190 [16];
  Am_Object select3;
  Am_Object local_178 [16];
  Am_Object select2;
  Am_Object group3;
  Am_Object group2;
  Am_Object local_150 [8];
  Am_Object local_148 [8];
  Am_Object local_140 [8];
  Am_Object local_138 [8];
  Am_Object local_130 [8];
  Am_Object scroll1;
  Am_Object undo_handler;
  Am_Object select1;
  Am_Object target;
  Am_Object group1;
  Am_Object local_100 [8];
  Am_Object local_f8 [8];
  Am_Object local_f0 [8];
  Am_Object local_e8 [8];
  Am_Object local_e0 [8];
  Am_Object local_d8 [8];
  Am_Object local_d0 [8];
  Am_Object local_c8 [8];
  Am_Object local_c0 [8];
  Am_Object window2;
  Am_Object local_b0 [8];
  Am_Object local_a8 [8];
  Am_Object local_a0 [8];
  Am_Object scroll2;
  Am_Object local_90 [8];
  Am_Object local_88 [8];
  Am_Object local_80 [8];
  Am_Object local_78 [8];
  Am_Object local_70 [8];
  Am_Object local_68 [8];
  Am_Object local_60 [8];
  Am_Object local_58 [8];
  Am_Object local_50 [8];
  Am_Object window1;
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Object local_30 [8];
  Am_Object local_28 [8];
  
  Am_Initialize();
  Am_Object::Create((char *)&select_list);
  uVar1 = Am_Object::Set((ushort)&select_list,0x66,300);
  uVar2 = Am_Object::Set(uVar1,0x67,400);
  Am_Object::Create((char *)local_1a0);
  uVar1 = Am_Object::Set((ushort)local_1a0,0x66,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)select_target);
  uVar5 = Am_Object::Set(uVar1,(Am_Constraint *)0x6b,(ulong)pAVar4);
  Am_Object::Create((char *)local_30);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,0x1a1,local_30,0);
  Am_Object::Am_Object(local_28,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_28,1,0);
  Am_Object::Create((char *)local_178);
  uVar1 = Am_Object::Set((ushort)local_178,100,100);
  uVar1 = Am_Object::Set(uVar1,0x66,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_38,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_38,1,0);
  Am_Object::Create((char *)local_190);
  uVar1 = Am_Object::Set((ushort)local_190,100,100);
  uVar1 = Am_Object::Set(uVar1,0x65,100);
  uVar1 = Am_Object::Set(uVar1,0x66,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Add(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_40,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_40,1,0);
  Am_Object::Am_Object(&group1,pAVar6);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(local_190);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(local_178);
  Am_Object::~Am_Object(local_28);
  Am_Object::~Am_Object(local_30);
  Am_Object::~Am_Object(local_1a0);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)&select_list);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&group1);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&select_list,(Am_Wrapper *)0x193,(ulong)pAVar3);
  Am_Object::Am_Object(&select1,pAVar6);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)&undo_handler);
  Am_Object::Create((char *)local_190);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set((ushort)local_190,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&undo_handler);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x174,(ulong)pAVar3);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x89,_Am_Window_Destroy_And_Exit_Method);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
  uVar2 = Am_Object::Add(uVar1,(Am_Constraint *)0x94,(ulong)pAVar4);
  Am_Object::Create((char *)&group2);
  Am_Value_List::Am_Value_List(&select_list);
  Am_Object::Create((char *)&select2);
  uVar1 = Am_Object::Set((ushort)&select2,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x10601b);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_1a0);
  uVar5 = Am_Value_List::Add(local_1a0,"Item1",1);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar5,"Item2",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar5 = Am_Value_List::Add(&select_list,pAVar3,1);
  Am_Object::Create((char *)&scroll1);
  uVar1 = Am_Object::Set((ushort)&scroll1,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x106033);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_178);
  uVar8 = Am_Value_List::Add(local_178,"New",1);
  uVar8 = Am_Value_List::Add(uVar8,"Middle",1);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar8,"Old",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar5,pAVar3,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&group2,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(local_50,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_50,1,0);
  Am_Object::Create((char *)&group3);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set((ushort)&group3,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar5 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  Am_Object::Am_Object(local_60,&group1);
  uVar5 = Am_Object::Add_Part(uVar5,local_60,1,0);
  Am_Object::Am_Object(local_68,&select1);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,local_68,1,0);
  Am_Object::Am_Object(local_58,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_58,1,0);
  Am_Object::Am_Object(&window1,pAVar6);
  Am_Object::~Am_Object(local_58);
  Am_Object::~Am_Object(local_68);
  Am_Object::~Am_Object(local_60);
  Am_Object::~Am_Object(&group3);
  Am_Object::~Am_Object(local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_178);
  Am_Object::~Am_Object(&scroll1);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_1a0);
  Am_Object::~Am_Object(&select2);
  Am_Value_List::~Am_Value_List(&select_list);
  Am_Object::~Am_Object(&group2);
  Am_Object::~Am_Object(local_190);
  Am_Object::Create((char *)&select_list);
  uVar1 = Am_Object::Set((ushort)&select_list,0x66,1000);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,0x67,1000);
  Am_Object::Am_Object(&group2,pAVar6);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)&select_list);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&group2);
  uVar1 = Am_Object::Set((ushort)&select_list,(Am_Wrapper *)0x193,(ulong)pAVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x1a2,_Am_In_Target);
  Am_Object::Am_Object(&select2,pAVar6);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)&select_list);
  uVar1 = Am_Object::Set((ushort)&select_list,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x14);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Fill_To_Right);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Fill_To_Bottom);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  uVar1 = Am_Object::Set(uVar1,0x18e,1000);
  uVar1 = Am_Object::Set(uVar1,399,1000);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  uVar2 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_70,&group2);
  uVar2 = Am_Object::Add_Part(uVar2,local_70,1);
  Am_Object::Am_Object(local_78,&select2);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_78,1);
  Am_Object::Am_Object(&scroll1,pAVar6);
  Am_Object::~Am_Object(local_78);
  Am_Object::~Am_Object(local_70);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)local_178);
  uVar1 = Am_Object::Set((ushort)local_178,0x66,1000);
  uVar2 = Am_Object::Set(uVar1,0x67,1000);
  Am_Object::Create((char *)local_190);
  uVar1 = Am_Object::Set((ushort)local_190,0x66,200);
  uVar1 = Am_Object::Set(uVar1,0x67,300);
  uVar1 = Am_Object::Set(uVar1,0xa0,0x14);
  uVar5 = Am_Object::Set(uVar1,0xa1,0x14);
  Am_Object::Create((char *)&select3);
  Am_From_Owner((ushort)&select_list);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&select_list);
  uVar1 = Am_Object::Set((ushort)&select3,(Am_Constraint *)0x66,(ulong)pAVar4);
  Am_From_Owner((ushort)local_1a0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)local_1a0);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_88,pAVar6);
  uVar5 = Am_Object::Add_Part(uVar5,local_88,1);
  Am_Object::Am_Object(local_90,&scroll1);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,local_90,1);
  Am_Object::Am_Object(local_80,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_80,1);
  Am_Object::Am_Object(&group3,pAVar6);
  Am_Object::~Am_Object(local_80);
  Am_Object::~Am_Object(local_90);
  Am_Object::~Am_Object(local_88);
  Am_Formula::~Am_Formula((Am_Formula *)local_1a0);
  Am_Formula::~Am_Formula((Am_Formula *)&select_list);
  Am_Object::~Am_Object(&select3);
  Am_Object::~Am_Object(local_190);
  Am_Object::~Am_Object(local_178);
  Am_Object::Create((char *)&select_list);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&group3);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&select_list,(Am_Wrapper *)0x193,(ulong)pAVar3);
  Am_Object::Am_Object(&select3,pAVar6);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)&select_list);
  uVar1 = Am_Object::Set((ushort)&select_list,0x66,300);
  uVar1 = Am_Object::Set(uVar1,0x67,400);
  uVar1 = Am_Object::Set(uVar1,0x18e,1000);
  uVar1 = Am_Object::Set(uVar1,399,1000);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
  uVar2 = Am_Object::Set(uVar1,(Am_Wrapper *)0x190,(ulong)pAVar3);
  Am_Object::Am_Object(local_a0,&group3);
  uVar2 = Am_Object::Add_Part(uVar2,local_a0,1);
  Am_Object::Am_Object(local_a8,&select3);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_a8,1);
  Am_Object::Am_Object(&scroll2,pAVar6);
  Am_Object::~Am_Object(local_a8);
  Am_Object::~Am_Object(local_a0);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)&select_list);
  uVar1 = Am_Object::Set((ushort)&select_list,100,400);
  uVar1 = Am_Object::Set(uVar1,0x65,0x82);
  uVar1 = Am_Object::Set(uVar1,0x66,100);
  uVar1 = Am_Object::Set(uVar1,0x67,0x28);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)select_target);
  uVar2 = Am_Object::Set(uVar1,(Am_Constraint *)0x6b,(ulong)pAVar4);
  Am_Object::Create((char *)local_1a0);
  uVar1 = Am_Object::Set((ushort)local_1a0,(Am_Method_Wrapper *)0xca,(ulong)drop_do.from_wrapper);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x146,(ulong)drop_undo.from_wrapper);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x147,(ulong)drop_undo.from_wrapper);
  Am_Object::Am_Object(local_b0,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,0x1a1,local_b0,0);
  Am_Object::Am_Object(&target,pAVar6);
  Am_Object::~Am_Object(local_b0);
  Am_Object::~Am_Object(local_1a0);
  Am_Object::~Am_Object((Am_Object *)&select_list);
  Am_Object::Create((char *)local_130);
  uVar1 = Am_Object::Set((ushort)local_130,100,0x136);
  uVar1 = Am_Object::Set(uVar1,0x66,600);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&undo_handler);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x174,(ulong)pAVar3);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x89,_Am_Window_Destroy_And_Exit_Method);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
  uVar1 = Am_Object::Add(uVar1,(Am_Constraint *)0x94,(ulong)pAVar4);
  _select_list = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
  uVar2 = Am_Object::Set(uVar1,(Am_Value *)0x97,(ulong)&select_list);
  Am_Object::Create((char *)local_138);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_1a0);
  Am_Object::Create((char *)local_140);
  uVar1 = Am_Object::Set((ushort)local_140,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x10601b);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_178);
  uVar5 = Am_Value_List::Add(local_178,"Item1",1);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar5,"Item2",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar5 = Am_Value_List::Add(local_1a0,pAVar3,1);
  Am_Object::Create((char *)local_148);
  uVar1 = Am_Object::Set((ushort)local_148,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x106033);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_190);
  uVar8 = Am_Value_List::Add(local_190,"New",1);
  uVar8 = Am_Value_List::Add(uVar8,"Middle",1);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar8,"Old",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar5,pAVar3,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)local_138,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(local_c0,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_c0,1,0);
  Am_Object::Create((char *)local_150);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set((ushort)local_150,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar5 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  Am_Object::Am_Object(local_d0,&scroll2);
  uVar5 = Am_Object::Add_Part(uVar5,local_d0,1,0);
  Am_Object::Am_Object(local_d8,&target);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,local_d8,1,0);
  Am_Object::Am_Object(local_c8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_c8,1,0);
  Am_Object::Am_Object(&window2,pAVar6);
  Am_Object::~Am_Object(local_c8);
  Am_Object::~Am_Object(local_d8);
  Am_Object::~Am_Object(local_d0);
  Am_Object::~Am_Object(local_150);
  Am_Object::~Am_Object(local_c0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_190);
  Am_Object::~Am_Object(local_148);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_178);
  Am_Object::~Am_Object(local_140);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_1a0);
  Am_Object::~Am_Object(local_138);
  Am_Value::~Am_Value((Am_Value *)&select_list);
  Am_Object::~Am_Object(local_130);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_1a0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&select1);
  uVar2 = Am_Value_List::Add(local_1a0,pAVar3,1);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&select2);
  uVar2 = Am_Value_List::Add(uVar2,pAVar3,1);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&select3);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar2,pAVar3,1);
  Am_Value_List::Am_Value_List(&select_list,pAVar7);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_1a0);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&select_list);
  Am_Object::Set((ushort)&select1,(Am_Wrapper *)0x1a0,(ulong)pAVar3);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&select_list);
  Am_Object::Set((ushort)&select2,(Am_Wrapper *)0x1a0,(ulong)pAVar3);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&select_list);
  Am_Object::Set((ushort)&select3,(Am_Wrapper *)0x1a0,(ulong)pAVar3);
  Am_Object::Am_Object(local_e0,&window1);
  uVar2 = Am_Object::Add_Part(&Am_Screen,local_e0,1,0);
  Am_Object::Am_Object(local_e8,&window2);
  uVar2 = Am_Object::Add_Part(uVar2,local_e8,1,0);
  Am_Object::Create((char *)local_178);
  uVar1 = Am_Object::Set((ushort)local_178,0x65,0x1cc);
  uVar1 = Am_Object::Set(uVar1,0x66,300);
  uVar1 = Am_Object::Set(uVar1,0x67,200);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&undo_handler);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x174,(ulong)pAVar3);
  uVar5 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x89,_Am_Window_Destroy_And_Exit_Method);
  Am_Object::Copy((char *)local_130);
  uVar1 = Am_Object::Set((ushort)local_130,100,100);
  uVar9 = Am_Object::Set(uVar1,0x65,0x50);
  Am_Object::Get_Object((ushort)local_190,uVar9);
  flags = Am_Object::Add((ushort)local_190,(Am_Method_Wrapper *)0x1a2,(ulong)no_reds.from_wrapper);
  Am_Object::Get_Owner(local_f8,flags);
  uVar5 = Am_Object::Add_Part(uVar5,local_f8,1,0);
  Am_Object::Create((char *)local_138);
  uVar1 = Am_Object::Set((ushort)local_138,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_1a0);
  Am_Object::Create((char *)local_140);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_140);
  uVar8 = Am_Value_List::Add(local_1a0,pAVar3,1);
  Am_Object::Create((char *)local_148);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_148);
  uVar8 = Am_Value_List::Add(uVar8,pAVar3,1);
  Am_Object::Create((char *)local_150);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_150);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar8,pAVar3,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(local_100,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,local_100,1,0);
  Am_Object::Am_Object(local_f0,pAVar6);
  Am_Object::Add_Part(uVar2,local_f0,1,0);
  Am_Object::~Am_Object(local_f0);
  Am_Object::~Am_Object(local_100);
  Am_Object::~Am_Object(local_150);
  Am_Object::~Am_Object(local_148);
  Am_Object::~Am_Object(local_140);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_1a0);
  Am_Object::~Am_Object(local_138);
  Am_Object::~Am_Object(local_f8);
  Am_Object::~Am_Object(local_190);
  Am_Object::~Am_Object(local_130);
  Am_Object::~Am_Object(local_178);
  Am_Object::~Am_Object(local_e8);
  Am_Object::~Am_Object(local_e0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Value_List::~Am_Value_List(&select_list);
  Am_Object::~Am_Object(&window2);
  Am_Object::~Am_Object(&target);
  Am_Object::~Am_Object(&scroll2);
  Am_Object::~Am_Object(&select3);
  Am_Object::~Am_Object(&group3);
  Am_Object::~Am_Object(&scroll1);
  Am_Object::~Am_Object(&select2);
  Am_Object::~Am_Object(&group2);
  Am_Object::~Am_Object(&window1);
  Am_Object::~Am_Object(&undo_handler);
  Am_Object::~Am_Object(&select1);
  Am_Object::~Am_Object(&group1);
  return 0;
}

Assistant:

int
main(void)
{
  Am_Initialize();

  Am_Object group1 =
      Am_Group.Create()
          .Set(Am_WIDTH, 300)
          .Set(Am_HEIGHT, 400)
          .Add_Part(
              Am_Rectangle.Create()
                  .Set(Am_WIDTH, 50)
                  .Set(Am_HEIGHT, 50)
                  .Set(Am_FILL_STYLE, Am_Red)
                  .Set(Am_LINE_STYLE, select_target)
                  .Add_Part(Am_DROP_TARGET, Am_Drop_Target_Command.Create()))
          .Add_Part(Am_Rectangle.Create()
                        .Set(Am_LEFT, 100)
                        .Set(Am_WIDTH, 50)
                        .Set(Am_HEIGHT, 50)
                        .Set(Am_FILL_STYLE, Am_Blue))
          .Add_Part(Am_Line.Create()
                        .Set(Am_LEFT, 100)
                        .Set(Am_TOP, 100)
                        .Set(Am_WIDTH, 50)
                        .Set(Am_HEIGHT, 50)
                        .Add(Am_FILL_STYLE, Am_Blue));

  Am_Object select1 = Am_Selection_Widget.Create().Set(Am_OPERATES_ON, group1);

  Am_Object undo_handler = Am_Multiple_Undo_Object.Create();

  Am_Object window1 =
      Am_Window.Create()
          .Set(Am_WIDTH, Am_Width_Of_Parts)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Set(Am_UNDO_HANDLER, undo_handler)
          .Set(Am_DESTROY_WINDOW_METHOD, Am_Window_Destroy_And_Exit_Method)
          .Add(Am_LAYOUT, Am_Vertical_Layout)
          .Add_Part(Am_Menu_Bar.Create().Set(
              Am_ITEMS,
              Am_Value_List()
                  .Add(Am_Command.Create("Menu")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu1")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("Item1").Add("Item2")))
                  .Add(Am_Command.Create("menu2")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu2")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("New").Add("Middle").Add(
                                    "Old")))))
          .Add_Part(Am_Group.Create()
                        .Set(Am_WIDTH, Am_Width_Of_Parts)
                        .Set(Am_HEIGHT, Am_Height_Of_Parts)
                        .Add_Part(group1)
                        .Add_Part(select1));

  Am_Object group2 = Am_Group.Create().Set(Am_WIDTH, 1000).Set(Am_HEIGHT, 1000);

  Am_Object select2 = Am_Selection_Widget.Create()
                          .Set(Am_OPERATES_ON, group2)
                          .Set(Am_DROP_TARGET_TEST, Am_In_Target);

  Am_Object scroll1 = Am_Scrolling_Group.Create()
                          .Set(Am_LEFT, 20)
                          .Set(Am_TOP, 20)
                          .Set(Am_WIDTH, Am_Fill_To_Right)
                          .Set(Am_HEIGHT, Am_Fill_To_Bottom)
                          .Set(Am_INNER_WIDTH, 1000)
                          .Set(Am_INNER_HEIGHT, 1000)
                          .Set(Am_FILL_STYLE, Am_Motif_Gray)
                          .Add_Part(group2)
                          .Add_Part(select2);

  Am_Object group3 =
      Am_Group.Create()
          .Set(Am_WIDTH, 1000)
          .Set(Am_HEIGHT, 1000)
          .Add_Part(Am_Group.Create()
                        .Set(Am_WIDTH, 200)
                        .Set(Am_HEIGHT, 300)
                        .Set(Am_RIGHT_OFFSET, 20)
                        .Set(Am_BOTTOM_OFFSET, 20)
                        .Add_Part(Am_Rectangle.Create()
                                      .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                                      .Set(Am_FILL_STYLE, Am_Motif_Gray))
                        .Add_Part(scroll1));

  Am_Object select3 = Am_Selection_Widget.Create().Set(Am_OPERATES_ON, group3);

  Am_Object scroll2 = Am_Scrolling_Group.Create()
                          .Set(Am_WIDTH, 300)
                          .Set(Am_HEIGHT, 400)
                          .Set(Am_INNER_WIDTH, 1000)
                          .Set(Am_INNER_HEIGHT, 1000)
                          .Set(Am_FILL_STYLE, Am_Motif_Gray)
                          .Set(Am_INNER_FILL_STYLE, Am_Motif_Light_Gray)
                          .Add_Part(group3)
                          .Add_Part(select3);

  Am_Object target =
      Am_Rectangle.Create()
          .Set(Am_LEFT, 400)
          .Set(Am_TOP, 130)
          .Set(Am_WIDTH, 100)
          .Set(Am_HEIGHT, 40)
          .Set(Am_FILL_STYLE, Am_White)
          .Set(Am_LINE_STYLE, select_target)
          .Add_Part(Am_DROP_TARGET, Am_Drop_Target_Command.Create()
                                        .Set(Am_DO_METHOD, drop_do)
                                        .Set(Am_UNDO_METHOD, drop_undo)
                                        .Set(Am_REDO_METHOD, drop_undo));

  Am_Object window2 =
      Am_Window.Create()
          .Set(Am_LEFT, 310)
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Set(Am_UNDO_HANDLER, undo_handler)
          .Set(Am_DESTROY_WINDOW_METHOD, Am_Window_Destroy_And_Exit_Method)
          .Add(Am_LAYOUT, Am_Vertical_Layout)
          .Set(Am_H_ALIGN, Am_LEFT_ALIGN)
          .Add_Part(Am_Menu_Bar.Create().Set(
              Am_ITEMS,
              Am_Value_List()
                  .Add(Am_Command.Create("Menu")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu1")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("Item1").Add("Item2")))
                  .Add(Am_Command.Create("menu2")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu2")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("New").Add("Middle").Add(
                                    "Old")))))
          .Add_Part(Am_Group.Create()
                        .Set(Am_WIDTH, Am_Width_Of_Parts)
                        .Set(Am_HEIGHT, Am_Height_Of_Parts)
                        .Add_Part(scroll2)
                        .Add_Part(target));

  Am_Value_List select_list =
      Am_Value_List().Add(select1).Add(select2).Add(select3);

  select1.Set(Am_MULTI_SELECTIONS, select_list);

  select2.Set(Am_MULTI_SELECTIONS, select_list);

  select3.Set(Am_MULTI_SELECTIONS, select_list);

  Am_Screen.Add_Part(window1).Add_Part(window2).Add_Part(
      Am_Window.Create()
          .Set(Am_TOP, 460)
          .Set(Am_WIDTH, 300)
          .Set(Am_HEIGHT, 200)
          .Set(Am_UNDO_HANDLER, undo_handler)
          .Set(Am_DESTROY_WINDOW_METHOD, Am_Window_Destroy_And_Exit_Method)
          .Add_Part(target.Copy()
                        .Set(Am_LEFT, 100)
                        .Set(Am_TOP, 80)
                        .Get_Object(Am_DROP_TARGET)
                        .Add(Am_DROP_TARGET_TEST, no_reds)
                        .Get_Owner())
          .Add_Part(
              Am_Button_Panel.Create()
                  .Set(Am_LEFT, 20)
                  .Set(Am_TOP, 10)
                  .Set(Am_ITEMS, Am_Value_List()
                                     .Add(Am_Undo_Command.Create())
                                     .Add(Am_Redo_Command.Create())
                                     .Add(Am_Quit_No_Ask_Command.Create()))));

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}